

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-writer.h
# Opt level: O1

void __thiscall
mp::ExprWriter<mp::internal::ExprTypes,_mp::BasicProblem<mp::BasicProblemParams<int>_>::VarNamer>::
VisitNumberOf(ExprWriter<mp::internal::ExprTypes,_mp::BasicProblem<mp::BasicProblemParams<int>_>::VarNamer>
              *this,NumberOfExpr e)

{
  Buffer<char> *pBVar1;
  ulong uVar2;
  
  pBVar1 = this->writer_->buffer_;
  uVar2 = pBVar1->size_ + 9;
  if (pBVar1->capacity_ < uVar2) {
    (**pBVar1->_vptr_Buffer)(pBVar1,uVar2);
  }
  builtin_strncpy(pBVar1->ptr_ + pBVar1->size_,"numberof ",9);
  pBVar1->size_ = uVar2;
  Visit(this,(NumericExpr)
             ((ExprBase *)
             ((long)e.super_BasicExpr<(mp::expr::Kind)42,_(mp::expr::Kind)45>.super_ExprBase.impl_ +
             8))->impl_,0);
  pBVar1 = this->writer_->buffer_;
  uVar2 = pBVar1->size_ + 4;
  if (pBVar1->capacity_ < uVar2) {
    (**pBVar1->_vptr_Buffer)(pBVar1,uVar2);
  }
  builtin_strncpy(pBVar1->ptr_ + pBVar1->size_," in ",4);
  pBVar1->size_ = uVar2;
  ExprWriter<mp::internal::ExprTypes,mp::BasicProblem<mp::BasicProblemParams<int>>::VarNamer>::
  WriteArgs<mp::internal::ExprIterator<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>>
            ((ExprWriter<mp::internal::ExprTypes,mp::BasicProblem<mp::BasicProblemParams<int>>::VarNamer>
              *)this,(Impl **)((long)e.super_BasicExpr<(mp::expr::Kind)42,_(mp::expr::Kind)45>.
                                     super_ExprBase.impl_ + 0x10),
             (Impl **)((long)*(int *)((long)e.
                                            super_BasicExpr<(mp::expr::Kind)42,_(mp::expr::Kind)45>.
                                            super_ExprBase.impl_ + 4) * 8 +
                      (long)e.super_BasicExpr<(mp::expr::Kind)42,_(mp::expr::Kind)45>.super_ExprBase
                            .impl_ + 8),", ",0);
  return;
}

Assistant:

void ExprWriter<ExprTypes, VN>::VisitNumberOf(NumberOfExpr e) {
  writer_ << "numberof ";
  typename NumberOfExpr::iterator i = e.begin();
  Visit(*i++, prec::UNKNOWN);
  writer_ << " in ";
  WriteArgs(i, e.end());
}